

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O1

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_>
::detach(QExplicitlySharedDataPointerV2<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_>
         *this)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar2;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_>
  copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).ptr;
  if (pQVar3 == (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0) {
    pQVar3 = (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
              *)operator_new(0x38);
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->d).ptr = pQVar3;
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  else if ((__int_type)
           (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int> != 1) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
              *)operator_new(0x38);
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    std::
    _Rb_tree<QFontDef,_std::pair<const_QFontDef,_QFontEngineData_*>,_std::_Select1st<std::pair<const_QFontDef,_QFontEngineData_*>_>,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>
    ::_Rb_tree(&(pQVar2->m)._M_t,&(pQVar3->m)._M_t);
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
    local_30 = (QExplicitlySharedDataPointerV2<QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>_>
                )(this->d).ptr;
    (this->d).ptr = pQVar2;
    ~QExplicitlySharedDataPointerV2(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void detach()
    {
        if (!d) {
            // should this codepath be here on in all user's detach()?
            d.reset(new T);
            d->ref.ref();
        } else if (d->ref.loadRelaxed() != 1) {
            // TODO: qAtomicDetach here...?
            QExplicitlySharedDataPointerV2 copy(new T(*d));
            swap(copy);
        }
    }